

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoBodies.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintTwoBodies::MultiplyAndAdd
          (ChConstraintTwoBodies *this,double *result,ChVectorDynamic<double> *vect)

{
  ChVariables *pCVar1;
  Scalar SVar2;
  VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> VStack_a8;
  Product<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
  local_70;
  
  pCVar1 = (this->super_ChConstraintTwo).variables_a;
  if (pCVar1->disabled == false) {
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&VStack_a8,vect,(long)pCVar1->offset,6);
    Eigen::
    Product<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>
    ::Product(&local_70,&this->Cq_a,
              &VStack_a8.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
    SVar2 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_70);
    *result = SVar2 + *result;
  }
  pCVar1 = (this->super_ChConstraintTwo).variables_b;
  if (pCVar1->disabled == false) {
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&VStack_a8,vect,(long)pCVar1->offset,6);
    Eigen::
    Product<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>
    ::Product(&local_70,&this->Cq_b,
              &VStack_a8.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
    SVar2 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_70);
    *result = SVar2 + *result;
  }
  return;
}

Assistant:

void ChConstraintTwoBodies::MultiplyAndAdd(double& result, const ChVectorDynamic<double>& vect) const {
    if (variables_a->IsActive()) {
        result += Cq_a * vect.segment(variables_a->GetOffset(), 6);
    }

    if (variables_b->IsActive()) {
        result += Cq_b * vect.segment(variables_b->GetOffset(), 6);
    }
}